

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_for_error.hpp
# Opt level: O0

void check_for_error<SyncFixture_SyncToBadVersions_Test::TestBody()::__0>
               (anon_class_8_1_8991fb9c test_fn,int err,error_category *category)

{
  bool bVar1;
  char *message;
  AssertHelper local_b0;
  Message local_a8 [2];
  system_error *anon_var_0;
  type e;
  byte local_65;
  bool gtest_caught_expected;
  undefined1 auStack_58 [8];
  TrueWithString gtest_msg;
  anon_class_24_3_a52091c5 f;
  error_category *category_local;
  anon_class_8_1_8991fb9c aStack_10;
  int err_local;
  anon_class_8_1_8991fb9c test_fn_local;
  
  gtest_msg.value.field_2._8_8_ = &stack0xfffffffffffffff0;
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_58 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  aStack_10.this = test_fn.this;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_58);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_58);
  if (bVar1) {
    local_65 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      check_for_error<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_sync.cpp:145:22)>
      ::anon_class_24_3_a52091c5::operator()
                ((anon_class_24_3_a52091c5 *)((long)&gtest_msg.value.field_2 + 8));
    }
    if ((local_65 & 1) != 0) goto LAB_0024ac12;
    std::__cxx11::string::operator=
              ((string *)auStack_58,
               "Expected: f () throws an exception of type std::system_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_a8);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,message);
  testing::internal::AssertHelper::operator=(&local_b0,local_a8);
  testing::internal::AssertHelper::~AssertHelper(&local_b0);
  testing::Message::~Message(local_a8);
LAB_0024ac12:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_58);
  return;
}

Assistant:

void check_for_error (Function test_fn, int err, std::error_category const & category) {
#ifdef PSTORE_EXCEPTIONS
    auto f = [&] () {
        try {
            test_fn ();
        } catch (std::system_error const & ex) {
            EXPECT_EQ (category, ex.code ().category ());
            EXPECT_EQ (err, ex.code ().value ());
            throw;
        }
    };
    EXPECT_THROW (f (), std::system_error);
#else
    (void) test_fn;
    (void) err;
    (void) category;
#endif // PSTORE_EXCEPTIONS
}